

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Decode
          (Minefield_Query_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer puVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  Minefield_Query_PDU *pMVar2;
  KUINT16 KVar3;
  KException *this_01;
  int iVar4;
  undefined7 in_register_00000011;
  KUINT16 j;
  ushort uVar5;
  byte bVar6;
  allocator<char> local_61;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_60;
  Minefield_Query_PDU *local_58;
  KUINT16 ui16Tmp;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x27 < iVar4 + (uint)KVar3) {
    std::
    vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ::clear(&this->m_vPoints);
    puVar1 = (this->m_vui16SensorTypes).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16SensorTypes).
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    local_60 = &this->m_vui16SensorTypes;
    Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
    (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ReqID,stream);
    KDataStream::Read(stream,&this->m_ui8ReqID);
    KDataStream::Read(stream,&this->m_ui8NumPerimPoints);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    KDataStream::Read(stream,&this->m_ui8NumSensTyp);
    (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_DataFilter,stream);
    local_58 = this;
    (*(this->m_MineTypFilter).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_MineTypFilter,stream);
    for (bVar6 = 0; this_00 = local_60, bVar6 < this->m_ui8NumPerimPoints; bVar6 = bVar6 + 1) {
      DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&ui16Tmp,stream);
      std::
      vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
      ::emplace_back<KDIS::DATA_TYPE::PerimeterPointCoordinate>
                (&this->m_vPoints,(PerimeterPointCoordinate *)&ui16Tmp);
      DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&ui16Tmp);
    }
    ui16Tmp = 0;
    for (uVar5 = 0; pMVar2 = local_58, uVar5 < this->m_ui8NumSensTyp; uVar5 = uVar5 + 1) {
      KDataStream::Read<unsigned_short>(stream,&ui16Tmp);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(this_00,&ui16Tmp);
    }
    calcPadding(local_58);
    if (pMVar2->m_bNeedsPadding != false) {
      KDataStream::Read<unsigned_short>(stream,&pMVar2->m_ui16Padding1);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ui16Tmp,"Decode",&local_61);
  KException::KException(this_01,(KString *)&ui16Tmp,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Query_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_QUERY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vui16SensorTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_ui8ReqID
           >> m_ui8NumPerimPoints
           >> m_ui8Padding1
           >> m_ui8NumSensTyp
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTypFilter;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    KUINT16 ui16Tmp = 0;
    for( KUINT16 j = 0; j < m_ui8NumSensTyp; ++j )
    {
        stream >> ui16Tmp;
        m_vui16SensorTypes.push_back( ui16Tmp );
    }

    // Does the PDU contain padding?
    calcPadding();
    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }
}